

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleQueue.hpp
# Opt level: O0

optional<helics::ActionMessage> * __thiscall
gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop
          (SimpleQueue<helics::ActionMessage,_std::mutex> *this)

{
  bool bVar1;
  long in_RSI;
  optional<helics::ActionMessage> *in_RDI;
  optional<helics::ActionMessage> *poVar2;
  lock_guard<std::mutex> pullLock;
  optional<helics::ActionMessage> *val;
  ActionMessage *in_stack_ffffffffffffffa8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  SimpleQueue<helics::ActionMessage,_std::mutex> *in_stack_ffffffffffffffe0;
  
  poVar2 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffffb0,(mutex_type *)in_stack_ffffffffffffffa8);
  checkPullandSwap(in_stack_ffffffffffffffe0);
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)poVar2);
  if (bVar1) {
    std::optional<helics::ActionMessage>::optional(poVar2);
  }
  else {
    poVar2 = (optional<helics::ActionMessage> *)(in_RSI + 0x68);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)poVar2);
    std::optional<helics::ActionMessage>::optional<helics::ActionMessage,_true>
              (poVar2,in_stack_ffffffffffffffa8);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_back
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x4c31ef);
    checkPullandSwap(in_stack_ffffffffffffffe0);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4c3241);
  return in_RDI;
}

Assistant:

std::optional<X> pop()
        {
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            checkPullandSwap();
            if (queueEmptyFlag) {
                return std::nullopt;
            }
            std::optional<X> val(
                std::move(pullElements.back()));  // do it this way to
                                                  // allow moveable only
                                                  // types
            pullElements.pop_back();
            checkPullandSwap();
            return val;
        }